

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O0

uint64_t * refs_iter(refs_table_t *tbl,size_t first,size_t end)

{
  uint64_t d;
  uint64_t *bucket;
  size_t end_local;
  size_t first_local;
  refs_table_t *tbl_local;
  
  d = (uint64_t)(tbl->refs_table + first);
  while( true ) {
    if ((uint64_t *)d == tbl->refs_table + end) {
      return (uint64_t *)0x0;
    }
    if ((*(long *)d != 0) && (*(long *)d != 0x7fffffffffffffff)) break;
    d = d + 8;
  }
  return (uint64_t *)d;
}

Assistant:

uint64_t*
refs_iter(refs_table_t *tbl, size_t first, size_t end)
{
    // assert(first < tbl->refs_size);
    // assert(end <= tbl->refs_size);

    _Atomic(uint64_t)* bucket = tbl->refs_table + first;
    while (bucket != tbl->refs_table + end) {
        uint64_t d = atomic_load_explicit(bucket, memory_order_relaxed);
        if (d != 0 && d != refs_ts) return (uint64_t*)bucket;
        bucket++;
    }
    return NULL;
}